

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

string * __thiscall
yy::parser::yytnamerr__abi_cxx11_(string *__return_storage_ptr__,parser *this,char *yystr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  pointer pcVar3;
  bool bVar4;
  parser *ppVar5;
  parser *ppVar6;
  size_t sVar7;
  string *yyr;
  
  if (*(char *)&this->_vptr_parser != '\"') {
LAB_00105d15:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar7 = strlen((char *)this);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,this,(long)&this->_vptr_parser + sVar7);
    return __return_storage_ptr__;
  }
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar4 = false;
  ppVar6 = this;
LAB_00105caf:
  ppVar5 = (parser *)((long)&ppVar6->_vptr_parser + 1);
  bVar2 = *(byte *)((long)&ppVar6->_vptr_parser + 1);
  if (bVar2 < 0x5c) {
    if (bVar2 == 0x22) {
      bVar4 = true;
LAB_00105cf8:
      if (bVar4) {
        return __return_storage_ptr__;
      }
      pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      goto LAB_00105d15;
    }
    if ((bVar2 == 0x27) || (bVar2 == 0x2c)) goto LAB_00105cf8;
  }
  else if (bVar2 == 0x5c) {
    if (*(char *)((long)&ppVar6->_vptr_parser + 2) != '\\') {
      bVar4 = false;
      goto LAB_00105cf8;
    }
    ppVar5 = (parser *)((long)&ppVar6->_vptr_parser + 2);
  }
  ppVar6 = ppVar5;
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  goto LAB_00105caf;
}

Assistant:

std::string
  parser::yytnamerr_ (const char *yystr)
  {
    if (*yystr == '"')
      {
        std::string yyr;
        char const *yyp = yystr;

        for (;;)
          switch (*++yyp)
            {
            case '\'':
            case ',':
              goto do_not_strip_quotes;

            case '\\':
              if (*++yyp != '\\')
                goto do_not_strip_quotes;
              else
                goto append;

            append:
            default:
              yyr += *yyp;
              break;

            case '"':
              return yyr;
            }
      do_not_strip_quotes: ;
      }

    return yystr;
  }